

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void kratos::MergeWireAssignmentsVisitor::extract_sliced_stmts
               (Generator *generator,
               set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
               *sliced_stmts)

{
  pointer psVar1;
  pointer psVar2;
  long lVar3;
  undefined1 local_58 [8];
  shared_ptr<kratos::Stmt> stmt;
  undefined1 local_40 [8];
  shared_ptr<kratos::AssignStmt> assign_stmt;
  
  psVar1 = (generator->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (generator->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sliced_stmts;
  for (lVar3 = 0; (long)psVar1 - (long)psVar2 >> 4 != lVar3; lVar3 = lVar3 + 1) {
    Generator::get_stmt((Generator *)local_58,(uint32_t)generator);
    if (*(int *)((long)local_58 + 0x78) == 3) {
      Stmt::as<kratos::AssignStmt>((Stmt *)local_40);
      if (((*(Var **)((long)local_40 + 0xc0))->type_ == Slice) &&
         ((*(Var **)((long)local_40 + 200))->type_ == Slice)) {
        std::
        _Rb_tree<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::_Identity<std::shared_ptr<kratos::AssignStmt>>,std::less<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
        ::_M_emplace_unique<std::shared_ptr<kratos::AssignStmt>&>
                  ((_Rb_tree<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::_Identity<std::shared_ptr<kratos::AssignStmt>>,std::less<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
                    *)stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi,(shared_ptr<kratos::AssignStmt> *)local_40);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&assign_stmt);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  }
  return;
}

Assistant:

static void extract_sliced_stmts(Generator* generator,
                                     std::set<std::shared_ptr<AssignStmt>>& sliced_stmts) {
        uint64_t stmt_count = generator->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = generator->get_stmt(i);
            if (stmt->type() == StatementType::Assign) {
                auto assign_stmt = stmt->as<AssignStmt>();
                if (assign_stmt->left()->type() == VarType::Slice &&
                    assign_stmt->right()->type() == VarType::Slice) {
                    sliced_stmts.emplace(assign_stmt);
                }
            }
        }
    }